

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_build_codes(bit_io_t *bio,uint64_t *syms,uint64_t *freq,uint64_t n)

{
  ulong uVar1;
  long lVar2;
  uint64_t *puVar3;
  ulong max_cw_length;
  uint64_t cw_lens [64];
  
  shuff_indirect_sort(freq,syms,syms,n);
  shuff_calculate_minimum_redundancy(freq,syms,n);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    cw_lens[lVar2] = 0;
  }
  max_cw_length = 0;
  for (puVar3 = syms; puVar3 < syms + n; puVar3 = puVar3 + 1) {
    uVar1 = freq[*puVar3];
    if (max_cw_length < uVar1) {
      max_cw_length = uVar1;
    }
    cw_lens[uVar1] = cw_lens[uVar1] + 1;
  }
  shuff_build_canonical_arrays(cw_lens,max_cw_length);
  SHUFF_OUTPUT_ULONG(bio,n,'\x1b');
  SHUFF_OUTPUT_ULONG(bio,max_cw_length,'\x06');
  qsort(syms,n,8,shuff_pcmp);
  for (puVar3 = syms; puVar3 < syms + n; puVar3 = puVar3 + 1) {
    SHUFF_OUTPUT_UNARY_CODE(bio,max_cw_length - freq[*puVar3]);
  }
  shuff_interp_encode(bio,syms,n);
  shuff_generate_mapping(cw_lens,syms,freq,max_cw_length,n);
  return;
}

Assistant:

void shuff_build_codes(
    bit_io_t* bio, uint64_t* syms, uint64_t* freq, uint64_t n)
{
    uint64_t i;
    const uint64_t* p;
    uint64_t max_codeword_length; //, min_codeword_length;
    uint64_t cw_lens[SHUFF_L + 1];

    shuff_indirect_sort(freq, syms, syms, n);

    shuff_calculate_minimum_redundancy(freq, syms, n);

    // calculcate max_codeword_length and set cw_lens[]
    for (i = 0; i <= SHUFF_L; i++)
        cw_lens[i] = 0;
    // min_codeword_length = max_codeword_length = freq[syms[0]];
    max_codeword_length = 0;
    for (p = syms; p < syms + n; p++) {
        if (freq[*p] > max_codeword_length)
            max_codeword_length = freq[*p];
        cw_lens[freq[*p]]++;
    }

    shuff_build_canonical_arrays(cw_lens, max_codeword_length);

    SHUFF_OUTPUT_ULONG(bio, n, SHUFF_LOG2_MAX_SYMBOL);
    SHUFF_OUTPUT_ULONG(bio, max_codeword_length, SHUFF_LOG2_L);

    qsort(syms, n, sizeof(uint64_t), shuff_pcmp);

    for (p = syms; p < syms + n; p++) {
        SHUFF_OUTPUT_UNARY_CODE(bio, max_codeword_length - freq[*p]);
    }

    shuff_interp_encode(bio, syms, n);

    shuff_generate_mapping(cw_lens, syms, freq, max_codeword_length, n);
}